

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadTest::AttachShader::AttachShader
          (AttachShader *this,SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program,
          SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader,bool useSync,bool serverSync)

{
  deInt32 *pdVar1;
  GLenum GVar2;
  Program *pPVar3;
  SharedPtrStateBase *pSVar4;
  SharedPtrStateBase *pSVar5;
  SharedPtrStateBase **ppSVar6;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_48;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_38;
  
  Operation::Operation(&this->super_Operation,"AttachShader",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__AttachShader_0210dc98;
  (this->m_program).m_ptr = program->m_ptr;
  pSVar5 = program->m_state;
  (this->m_program).m_state = pSVar5;
  if (pSVar5 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_program).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_shader).m_ptr = shader->m_ptr;
  pSVar5 = shader->m_state;
  (this->m_shader).m_state = pSVar5;
  if (pSVar5 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_shader).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  local_38.m_ptr = &((this->m_program).m_ptr)->super_Object;
  local_38.m_state = (this->m_program).m_state;
  if (local_38.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_38.m_state)->strongRefCount = (local_38.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_38.m_state)->weakRefCount = (local_38.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_38);
  pSVar5 = local_38.m_state;
  if (local_38.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_38.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_38.m_ptr = (Object *)0x0;
      (*(local_38.m_state)->_vptr_SharedPtrStateBase[2])(local_38.m_state);
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_38.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_38.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_38.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  local_48.m_ptr = &((this->m_shader).m_ptr)->super_Object;
  local_48.m_state = (this->m_shader).m_state;
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_48.m_state)->weakRefCount = (local_48.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::readGLObject(&this->super_Operation,&local_48);
  pSVar5 = local_48.m_state;
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_48.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_48.m_ptr = (Object *)0x0;
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])(local_48.m_state);
    }
    LOCK();
    pdVar1 = &pSVar5->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_48.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_48.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  GVar2 = ((this->m_shader).m_ptr)->type;
  if (GVar2 == 0x8b30) {
    pPVar3 = (this->m_program).m_ptr;
    pSVar4 = (pPVar3->fragmentShader).m_state;
    pSVar5 = shader->m_state;
    if (pSVar4 == pSVar5) {
      return;
    }
    ppSVar6 = &(pPVar3->fragmentShader).m_state;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar4->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (pPVar3->fragmentShader).m_ptr = (Shader *)0x0;
        (*((pPVar3->fragmentShader).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(*ppSVar6)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (*ppSVar6 != (SharedPtrStateBase *)0x0) {
          (*(*ppSVar6)->_vptr_SharedPtrStateBase[1])();
        }
        *ppSVar6 = (SharedPtrStateBase *)0x0;
      }
      pSVar5 = shader->m_state;
    }
    (pPVar3->fragmentShader).m_ptr = shader->m_ptr;
    (pPVar3->fragmentShader).m_state = pSVar5;
  }
  else {
    if (GVar2 != 0x8b31) {
      return;
    }
    pPVar3 = (this->m_program).m_ptr;
    pSVar4 = (pPVar3->vertexShader).m_state;
    pSVar5 = shader->m_state;
    if (pSVar4 == pSVar5) {
      return;
    }
    ppSVar6 = &(pPVar3->vertexShader).m_state;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar4->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (pPVar3->vertexShader).m_ptr = (Shader *)0x0;
        (*((pPVar3->vertexShader).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(*ppSVar6)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (*ppSVar6 != (SharedPtrStateBase *)0x0) {
          (*(*ppSVar6)->_vptr_SharedPtrStateBase[1])();
        }
        *ppSVar6 = (SharedPtrStateBase *)0x0;
      }
      pSVar5 = shader->m_state;
    }
    (pPVar3->vertexShader).m_ptr = shader->m_ptr;
    (pPVar3->vertexShader).m_state = pSVar5;
  }
  if (pSVar5 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (*ppSVar6)->weakRefCount = (*ppSVar6)->weakRefCount + 1;
    UNLOCK();
  }
  return;
}

Assistant:

AttachShader::AttachShader (SharedPtr<Program> program, SharedPtr<Shader> shader, bool useSync, bool serverSync)
	: Operation	("AttachShader", useSync, serverSync)
	, m_program	(program)
	, m_shader	(shader)
{
	modifyGLObject(SharedPtr<Object>(m_program));
	readGLObject(SharedPtr<Object>(m_shader));

	if (m_shader->type == GL_VERTEX_SHADER)
		m_program->vertexShader = shader;
	else if (m_shader->type == GL_FRAGMENT_SHADER)
		m_program->fragmentShader = shader;
	else
		DE_ASSERT(false);
}